

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Compiler::processScope
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *line)

{
  pointer *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  bool bVar2;
  DataType varType;
  int iVar3;
  uint uVar4;
  const_reference pvVar5;
  reference pvVar6;
  unsigned_long_long uVar7;
  string *psVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  reference line_00;
  reference pvVar12;
  reference pvVar13;
  reference pSVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar15;
  string *local_6d8;
  char local_570 [32];
  Scope *local_550;
  const_iterator local_548;
  undefined1 local_533;
  allocator local_532;
  allocator local_531;
  string local_530 [32];
  Variable local_510;
  uint local_4dc;
  undefined1 local_4d8 [4];
  uint variablesToRemove;
  Scope endingScope;
  Scope *previousScope_1;
  string *local_420;
  string local_418 [32];
  iterator local_3f8;
  size_type local_3f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  undefined1 local_3d0 [8];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  initialisationArguments;
  undefined1 local_398 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  anon_class_16_2_1156e026 clearScopeVariables;
  string local_368 [32];
  uint *local_348;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_340;
  const_iterator local_338;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_330;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_328;
  const_iterator local_320;
  Compiler *local_318;
  Scope *current;
  __normal_iterator<Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_> local_308;
  iterator iter_1;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_2f8;
  Variable local_2f0;
  allocator local_2b9;
  string local_2b8 [32];
  Variable local_298;
  uint local_264;
  Variable *pVStack_260;
  uint a;
  Variable *var;
  undefined1 local_222;
  allocator local_221;
  uint local_220;
  undefined1 local_21a;
  allocator local_219;
  uint aSize;
  string local_1f8 [32];
  string local_1d8 [8];
  string arraySize;
  string local_1b8 [8];
  string arrayName;
  string *identifier;
  undefined1 local_188 [4];
  DataType type;
  undefined1 local_180 [8];
  reverse_iterator iter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  undefined1 local_140 [8];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  argumentNames;
  value_type local_11c;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_118;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_110;
  const_iterator local_108;
  uint *local_100;
  value_type local_f4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_f0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_e8;
  const_iterator local_e0;
  reference local_d8;
  Scope *previousScope;
  undefined1 local_c0 [8];
  Scope newScope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *line_local;
  Compiler *this_local;
  
  newScope.childDataMembers.super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)line;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](line,0);
  bVar1 = std::operator==(pvVar5,"{");
  if (bVar1) {
    Scope::Scope((Scope *)local_c0,&this->expectedScopeType);
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
    local_c0._4_4_ = (undefined4)sVar9;
    newScope.type = this->scopeDepth;
    newScope.scopeDepth = VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
    if ((this->expectedScopeType).type == ELSE) {
      local_d8 = std::vector<Scope,_std::allocator<Scope>_>::back(&this->pastScopes);
      local_f0._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->bytecode);
      uVar4 = local_d8->endPos;
      local_d8->endPos = uVar4 + 1;
      local_e8 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator+(&local_f0,(ulong)uVar4);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_e0,&local_e8);
      local_f4 = 5;
      local_100 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
                                    (&this->bytecode,local_e0,&local_f4);
      pvVar15 = &this->bytecode;
      local_118._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar15);
      uVar4 = local_d8->endPos;
      local_d8->endPos = uVar4 + 1;
      local_110 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator+(&local_118,(ulong)uVar4);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_108,&local_110);
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar15);
      local_11c = (int)sVar9 + 1;
      argumentNames.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
                              (pvVar15,local_108,&local_11c);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->bytecode,(ulong)(local_d8->startPos - 1));
      *pvVar10 = *pvVar10 + 2;
    }
    else if ((this->expectedScopeType).type == FUNCTION) {
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_140);
      std::__cxx11::string::string((string *)&iter,(string *)&newScope.bytecodeSizeBefore);
      Parser::extractBracketArguments(&local_158,&this->parser,(string *)&iter);
      Parser::tokenizeFile
                (&this->parser,&local_158,
                 (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)local_140);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_158);
      std::__cxx11::string::~string((string *)&iter);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::rbegin((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_180);
      while( true ) {
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::rend((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_188);
        bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                 *)local_180,
                                (reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                 *)local_188);
        if (!bVar1) break;
        pvVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                              *)local_180);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](pvVar6,0);
        varType = stringToDataType(pvVar11);
        pvVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                              *)local_180);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](pvVar6,1);
        bVar1 = Parser::isArrayDefinition(&this->parser,pvVar11);
        if (bVar1) {
          std::__cxx11::string::string(local_1b8);
          std::__cxx11::string::string(local_1d8);
          std::__cxx11::string::string(local_1f8,(string *)pvVar11);
          Parser::splitArrayDefinition
                    (&this->parser,(string *)local_1f8,(string *)local_1b8,(string *)local_1d8);
          std::__cxx11::string::~string(local_1f8);
          std::__cxx11::string::string((string *)&aSize,local_1d8);
          iVar3 = VirtualStack::isVariable(&(this->igen).super_VirtualStack,(string *)&aSize);
          std::__cxx11::string::~string((string *)&aSize);
          if (0 < iVar3) {
            local_21a = 1;
            psVar8 = (string *)__cxa_allocate_exception(0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (psVar8,"Arrays of a dynamic size are not currently supported sorry!",
                       &local_219);
            local_21a = 0;
            __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          uVar7 = std::__cxx11::stoull((string *)local_1d8,(size_t *)0x0,10);
          local_220 = (uint)uVar7;
          if (local_220 == 0) {
            local_222 = 1;
            psVar8 = (string *)__cxa_allocate_exception(0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(psVar8,"Array must not contain no elements",&local_221);
            local_222 = 0;
            __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          Variable::Variable((Variable *)&var,(string *)local_1b8,varType);
          VirtualStack::push(&(this->igen).super_VirtualStack,(Variable *)&var);
          Variable::~Variable((Variable *)&var);
          uVar4 = VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
          pVStack_260 = VirtualStack::getVariable(&(this->igen).super_VirtualStack,uVar4 - 1);
          pVStack_260->isArray = true;
          pVStack_260->arrayLength = local_220;
          for (local_264 = 0; local_264 < local_220 - 1; local_264 = local_264 + 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2b8,"",&local_2b9);
            Variable::Variable(&local_298,(string *)local_2b8,varType);
            VirtualStack::push(&(this->igen).super_VirtualStack,&local_298);
            Variable::~Variable(&local_298);
            std::__cxx11::string::~string(local_2b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
          }
          std::__cxx11::string::~string(local_1d8);
          std::__cxx11::string::~string(local_1b8);
        }
        else {
          Variable::Variable(&local_2f0,pvVar11,varType);
          VirtualStack::push(&(this->igen).super_VirtualStack,&local_2f0);
          Variable::~Variable(&local_2f0);
        }
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::operator++(&local_2f8,(int)local_180);
      }
      sVar9 = std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::size((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_140);
      newScope._92_4_ = SUB84(sVar9,0);
      std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>
                ((vector<Scope,std::allocator<Scope>> *)&this->functionCallStack,(Scope *)local_c0);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)local_140);
    }
    std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>
              ((vector<Scope,std::allocator<Scope>> *)&this->openScopeStack,(Scope *)local_c0);
    this->scopeDepth = this->scopeDepth + 1;
    Scope::~Scope((Scope *)local_c0);
  }
  else {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)newScope.childDataMembers.
                             super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,0);
    bVar1 = std::operator==(pvVar5,"}");
    if (!bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x20);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)newScope.childDataMembers.
                      super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0);
      std::operator+(local_570,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Error processing scope change, unknown operator \'");
      std::operator+(__lhs,local_570);
      __cxa_throw(__lhs,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    this->scopeDepth = this->scopeDepth + -1;
    if (this->scopeDepth < 0) {
      iter_1._M_current._6_1_ = 1;
      psVar8 = (string *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (psVar8,"No such scope to close",(allocator *)((long)&iter_1._M_current + 7));
      iter_1._M_current._6_1_ = 0;
      __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    local_308._M_current =
         (Scope *)std::vector<Scope,_std::allocator<Scope>_>::begin(&this->openScopeStack);
    while( true ) {
      current = (Scope *)std::vector<Scope,_std::allocator<Scope>_>::end(&this->openScopeStack);
      bVar1 = __gnu_cxx::operator!=
                        (&local_308,
                         (__normal_iterator<Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_> *)
                         &current);
      if (!bVar1) break;
      local_318 = (Compiler *)
                  __gnu_cxx::__normal_iterator<Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_>
                  ::operator*(&local_308);
      if (*(int *)&(local_318->parser)._vptr_Parser == this->scopeDepth) {
        uVar4 = *(uint *)((long)&local_318->_vptr_Compiler + 4);
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
        if ((uVar4 == sVar9) && (*(ScopeType *)&local_318->_vptr_Compiler != FUNCTION)) {
          pvVar15 = &this->bytecode;
          local_330._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar15);
          local_328 = __gnu_cxx::
                      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator+(&local_330,
                                  (ulong)*(uint *)&(local_318->parser).seperatorTokens.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
          __gnu_cxx::
          __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          ::__normal_iterator<unsigned_int*>
                    ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      *)&local_320,&local_328);
          local_340._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar15);
          __gnu_cxx::
          __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          ::__normal_iterator<unsigned_int*>
                    ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      *)&local_338,&local_340);
          local_348 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                                        (pvVar15,local_320,local_338);
          (local_318->igen).super_VirtualStack.stack[0].field_0x18 = 1;
          sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar15);
          *(int *)((long)&(local_318->parser).seperatorTokens.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + 4) = (int)sVar9;
          std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>
                    ((vector<Scope,std::allocator<Scope>> *)&this->pastScopes,(Scope *)local_318);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_368,"Empty scope. It has been optimised out, but removal is recommended."
                     ,(allocator *)((long)&clearScopeVariables.current + 7));
          displayWarning(this,(string *)local_368);
          std::__cxx11::string::~string(local_368);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&clearScopeVariables.current + 7));
          return;
        }
        clearScopeVariables.this = local_318;
        arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
        if (*(ScopeType *)&local_318->_vptr_Compiler == IF) {
          processScope::anon_class_16_2_1156e026::operator()
                    ((anon_class_16_2_1156e026 *)
                     &arguments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&this->bytecode,
                               (ulong)(*(uint *)((long)&local_318->_vptr_Compiler + 4) - 1));
          *pvVar10 = (int)sVar9 - 1;
        }
        else if (*(ScopeType *)&local_318->_vptr_Compiler == WHILE) {
          processScope::anon_class_16_2_1156e026::operator()
                    ((anon_class_16_2_1156e026 *)
                     &arguments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          InstructionGenerator::genGoto
                    (&this->igen,*(uint *)((long)&(local_318->parser)._vptr_Parser + 4));
          sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&this->bytecode,
                               (ulong)(*(uint *)((long)&local_318->_vptr_Compiler + 4) - 1));
          *pvVar10 = (int)sVar9 - 1;
        }
        else if (*(ScopeType *)&local_318->_vptr_Compiler == FOR) {
          processScope::anon_class_16_2_1156e026::operator()
                    ((anon_class_16_2_1156e026 *)
                     &arguments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          this_00 = &initialisationArguments.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::string
                    ((string *)this_00,
                     (string *)
                     &(local_318->parser).seperatorTokens.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          Parser::extractBracketArguments
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_398,&this->parser,(string *)this_00);
          std::__cxx11::string::~string
                    ((string *)
                     &initialisationArguments.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_3d0);
          local_420 = local_418;
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_398,0);
          std::__cxx11::string::string(local_418,(string *)pvVar11);
          local_3f8 = (iterator)local_418;
          local_3f0 = 1;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)&previousScope_1 + 7));
          __l._M_len = local_3f0;
          __l._M_array = local_3f8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_3e8,__l,
                   (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&previousScope_1 + 7));
          Parser::tokenizeFile
                    (&this->parser,&local_3e8,
                     (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_3d0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_3e8);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)&previousScope_1 + 7));
          local_6d8 = (string *)&local_3f8;
          do {
            local_6d8 = local_6d8 + -0x20;
            std::__cxx11::string::~string(local_6d8);
          } while (local_6d8 != local_418);
          line_00 = std::
                    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)local_3d0,0);
          processVariable(this,line_00);
          InstructionGenerator::genGoto
                    (&this->igen,*(uint *)((long)&(local_318->parser)._vptr_Parser + 4));
          sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&this->bytecode,
                               (ulong)(*(uint *)((long)&local_318->_vptr_Compiler + 4) - 1));
          *pvVar10 = (int)sVar9 - 1;
          InstructionGenerator::genStackWalk
                    (&this->igen,*(uint *)&(local_318->igen).super_VirtualStack.stack[0].isArray);
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_3d0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_398);
        }
        else if (*(ScopeType *)&local_318->_vptr_Compiler == ELSE) {
          processScope::anon_class_16_2_1156e026::operator()
                    ((anon_class_16_2_1156e026 *)
                     &arguments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          endingScope.childDataMembers.super__Vector_base<Variable,_std::allocator<Variable>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)std::vector<Scope,_std::allocator<Scope>_>::back(&this->pastScopes);
          if ((((reference)
               endingScope.childDataMembers.super__Vector_base<Variable,_std::allocator<Variable>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage)->wasOptimisedOut & 1U) == 0) {
            sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&this->bytecode,
                                 (ulong)(*(int *)&(endingScope.childDataMembers.
                                                                                                      
                                                  super__Vector_base<Variable,_std::allocator<Variable>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->field_0x14 - 1));
            *pvVar10 = (value_type)sVar9;
          }
        }
        else {
          if (*(ScopeType *)&local_318->_vptr_Compiler != FUNCTION) {
            local_533 = 1;
            psVar8 = (string *)__cxa_allocate_exception(0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(psVar8,"Ending unknown scope type",&local_532);
            local_533 = 0;
            __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          pvVar13 = std::vector<Scope,_std::allocator<Scope>_>::back(&this->functionCallStack);
          Scope::Scope((Scope *)local_4d8,pvVar13);
          std::vector<Scope,_std::allocator<Scope>_>::pop_back(&this->functionCallStack);
          while( true ) {
            bVar2 = std::
                    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::empty(&this->functionEndGotos);
            bVar1 = false;
            if (!bVar2) {
              pvVar12 = std::
                        vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ::back(&this->functionEndGotos);
              uVar4 = pvVar12->first;
              sVar9 = std::vector<Scope,_std::allocator<Scope>_>::size(&this->functionCallStack);
              bVar1 = uVar4 == sVar9;
            }
            if (!bVar1) break;
            sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
            pvVar12 = std::
                      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ::back(&this->functionEndGotos);
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&this->bytecode,(ulong)pvVar12->second);
            *pvVar10 = (value_type)sVar9;
            std::
            vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ::pop_back(&this->functionEndGotos);
          }
          local_4dc = VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
          local_4dc = local_4dc - endingScope.scopeDepth;
          if ((local_4dc != 0) &&
             (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&endingScope.field_0x38,"entry"), bVar1)) {
            InstructionGenerator::genStackWalk(&this->igen,local_4dc);
          }
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&endingScope.field_0x38,"entry");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_530,"returnPoint",&local_531);
            Variable::Variable(&local_510,(string *)local_530,INT);
            VirtualStack::push(&(this->igen).super_VirtualStack,&local_510);
            Variable::~Variable(&local_510);
            std::__cxx11::string::~string(local_530);
            std::allocator<char>::~allocator((allocator<char> *)&local_531);
            InstructionGenerator::genDynamicGoto(&this->igen);
          }
          Scope::~Scope((Scope *)local_4d8);
        }
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
        *(uint *)((long)&(local_318->parser).seperatorTokens.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) = (uint)sVar9;
        sVar9 = std::vector<Scope,_std::allocator<Scope>_>::size(&this->openScopeStack);
        if (1 < sVar9) {
          sVar9 = std::vector<Scope,_std::allocator<Scope>_>::size(&this->openScopeStack);
          pvVar13 = std::vector<Scope,_std::allocator<Scope>_>::operator[]
                              (&this->openScopeStack,sVar9 - 2);
          if (pvVar13->type == CLASS) {
            sVar9 = std::vector<Scope,_std::allocator<Scope>_>::size(&this->openScopeStack);
            pvVar13 = std::vector<Scope,_std::allocator<Scope>_>::operator[]
                                (&this->openScopeStack,sVar9 - 2);
            pSVar14 = __gnu_cxx::
                      __normal_iterator<Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_>::
                      operator*(&local_308);
            std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>
                      ((vector<Scope,std::allocator<Scope>> *)&pvVar13->childMemberScopes,pSVar14);
            goto LAB_0010a3db;
          }
        }
        pSVar14 = __gnu_cxx::__normal_iterator<Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_>
                  ::operator*(&local_308);
        std::vector<Scope,std::allocator<Scope>>::emplace_back<Scope&>
                  ((vector<Scope,std::allocator<Scope>> *)&this->pastScopes,pSVar14);
LAB_0010a3db:
        __gnu_cxx::__normal_iterator<Scope_const*,std::vector<Scope,std::allocator<Scope>>>::
        __normal_iterator<Scope*>
                  ((__normal_iterator<Scope_const*,std::vector<Scope,std::allocator<Scope>>> *)
                   &local_548,&local_308);
        std::vector<Scope,_std::allocator<Scope>_>::erase(&this->openScopeStack,local_548);
        return;
      }
      local_550 = (Scope *)__gnu_cxx::
                           __normal_iterator<Scope_*,_std::vector<Scope,_std::allocator<Scope>_>_>::
                           operator++(&local_308,0);
    }
  }
  return;
}

Assistant:

void Compiler::processScope(const std::vector<std::string> &line)
{
    if(line[0] == "{") //Scope open
    {
        //Setup the new scope, taking details from the expected scope and filling in the '{' dependent stuff
        Scope newScope = expectedScopeType;
        newScope.startPos = bytecode.size();
        newScope.scopeDepth = scopeDepth;
        newScope.stackSize = igen.getStackSize();

        if(expectedScopeType.type == Scope::ELSE)
        {
            Scope &previousScope = pastScopes.back(); // Get preceding scope
            bytecode.insert(bytecode.begin() + previousScope.endPos++, Instruction::GOTO);
            bytecode.insert(bytecode.begin() + previousScope.endPos++, bytecode.size()+1); //Temporary value, this will be filled in later.
            bytecode[previousScope.startPos-1] += 2;
        }
        else if(expectedScopeType.type == Scope::FUNCTION)
        {
            std::vector<std::vector<std::string>> argumentNames;
            parser.tokenizeFile(parser.extractBracketArguments(newScope.incrementor), argumentNames);
            for(auto iter = argumentNames.rbegin(); iter != argumentNames.rend(); iter++)
            {
                DataType type = stringToDataType((*iter)[0]);
                std::string &identifier = (*iter)[1];
                if(parser.isArrayDefinition(identifier)) //Check if it's an array
                {
                    //Split array definition into name and size
                    std::string arrayName;
                    std::string arraySize;
                    parser.splitArrayDefinition(identifier, arrayName, arraySize);

                    //Quick error check
                    if(igen.isVariable(arraySize) > 0)
                        throw std::string("Arrays of a dynamic size are not currently supported sorry!");

                    //Get array size as an integer
                    unsigned int aSize = std::stoull(arraySize);
                    if(aSize == 0)
                        throw std::string("Array must not contain no elements");

                    //Create first element with a name
                    igen.push(Variable(arrayName, type));

                    //Set it to an array
                    Variable &var = igen.getVariable(igen.getStackSize()-1);
                    var.isArray = true;
                    var.arrayLength = aSize;

                    //All elements after are unnamed so that when searching for the array, the first element will always be returned
                    for(unsigned int a = 0; a < aSize-1; a++)
                        igen.push(Variable("", type));
                }
                else //Else normal variable
                {
                    igen.push(Variable(identifier, type));
                }
            }
            newScope.argumentCount = argumentNames.size();
            functionCallStack.emplace_back(newScope);
        }
        openScopeStack.emplace_back(newScope);
        scopeDepth++;
    }
    else if(line[0] == "}") //Scope close
    {
        scopeDepth--;
        if(scopeDepth < 0) //No scope to close!
        {
            throw std::string("No such scope to close");
        }

        //Find which scope it is ending
        for(auto iter = openScopeStack.begin(); iter != openScopeStack.end();)
        {
            Scope &current = *iter;

            if(current.scopeDepth == scopeDepth) //We've found the scope that's ending
            {
                if(current.startPos == bytecode.size() && current.type != Scope::FUNCTION) //If the scope was empty, optimise it out
                {
                    bytecode.erase(bytecode.begin() + current.bytecodeSizeBefore, bytecode.end());
                    current.wasOptimisedOut = true;
                    current.endPos = bytecode.size();
                    pastScopes.emplace_back(current);
                    displayWarning("Empty scope. It has been optimised out, but removal is recommended.");
                    return;
                }


                //Called to clear this scope's variables
                auto clearScopeVariables = [&](unsigned int extraAmount = 0)
                {
                    //Remove variables created in the scope IF there's any
                    if(igen.getStackSize() != current.stackSize || extraAmount > 0)
                    {
                        igen.genStackWalk((igen.getStackSize() - current.stackSize) + extraAmount);
                    }
                };

                //Handle the scope end differently depending on its type
                if(current.type == Scope::IF) //If an IF scope is ending
                {
                    clearScopeVariables();

                    //Set the bytecode position to seek to if the IF statement should not run
                    bytecode[current.startPos-1] = bytecode.size()-1;
                }
                else if(current.type == Scope::WHILE) //If a WHILE scope is ending
                {
                    clearScopeVariables();

                    //Add the instructions to loop back around to the beginning of the while
                    igen.genGoto(current.statementPos);
                    bytecode[current.startPos-1] = bytecode.size()-1;
                }
                else if(current.type == Scope::FOR) //If a FOR scope is ending
                {
                    clearScopeVariables();

                    //Parse and insert increment instructions
                    std::vector<std::string> arguments = parser.extractBracketArguments(current.incrementor);
                    std::vector<std::vector<std::string>> initialisationArguments;
                    parser.tokenizeFile({arguments[0]}, initialisationArguments);

                    //Add the instructions to loop back around to the beginning of the for
                    processVariable(initialisationArguments[0]);
                    igen.genGoto(current.statementPos);
                    bytecode[current.startPos-1] = bytecode.size()-1;

                    //Remove initialization variables if needed
                    igen.genStackWalk(current.initialisationVariableCount);
                }
                else if(current.type == Scope::ELSE)
                {
                    clearScopeVariables();

                    Scope &previousScope = pastScopes.back(); // Get preceding scope
                    if(!previousScope.wasOptimisedOut)
                        bytecode[previousScope.endPos-1] = bytecode.size(); //Set the previous if's goto to this point after the else
                }
                else if(current.type == Scope::FUNCTION)
                {
                    //Get scope to return to from function stack
                    Scope endingScope = functionCallStack.back();
                    functionCallStack.pop_back();

                    //Set the function return gotos for this scope
                    while(!functionEndGotos.empty() && functionEndGotos.back().first == functionCallStack.size())
                    {
                        bytecode[functionEndGotos.back().second] = bytecode.size();
                        functionEndGotos.pop_back();
                    }

                    //Erase variables created except the exit point
                    unsigned int variablesToRemove = igen.getStackSize() - endingScope.stackSize;
                    if(variablesToRemove > 0 && endingScope.identifier != "entry") //Only resize if there's things to remove and this isn't the program end
                    {
                        igen.genStackWalk(variablesToRemove);
                    }

                    //Insert the dynamic goto IF it's not the program entry point
                    if(endingScope.identifier != "entry")
                    {
                        igen.push(Variable("returnPoint", DataType::INT));
                        igen.genDynamicGoto();
                    }
                }
                else
                {
                    throw std::string("Ending unknown scope type");
                }

                //Store the scope in pastScopes and erase it from currentScopes as it's no longer open
                current.endPos = bytecode.size();
                if(openScopeStack.size() > 1 && openScopeStack[openScopeStack.size()-2].type == Scope::CLASS) //If scope was created inside of a class, store in that class's past scope list
                {
                    openScopeStack[openScopeStack.size()-2].childMemberScopes.emplace_back(*iter);
                }
                else //Else store in the global past scope list
                {
                    pastScopes.emplace_back(*iter);
                }
                iter = openScopeStack.erase(iter);
                break;
            }
            else
            {
                iter++;
            }

        }
    }
    else
    {
        throw std::string("Error processing scope change, unknown operator '" + line[0] + "'");
    }
}